

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall Am_Drawonable_Impl::Lower_Window(Am_Drawonable_Impl *this,Am_Drawonable *target_d)

{
  undefined4 local_44;
  undefined1 local_40 [4];
  uint value_mask;
  XWindowChanges values;
  Am_Drawonable *target_d_local;
  Am_Drawonable_Impl *this_local;
  
  if (target_d == (Am_Drawonable *)0x0) {
    local_44 = 0x40;
  }
  else {
    local_44 = 0x60;
    values._16_8_ = target_d[1].title;
  }
  values.sibling._0_4_ = 1;
  values._32_8_ = target_d;
  XReconfigureWMWindow
            (this->screen->display,this->xlib_drawable,this->screen->screen_number,local_44,local_40
            );
  (*(this->super_Am_Drawonable)._vptr_Am_Drawonable[0x14])();
  return;
}

Assistant:

void Am_Drawonable_Impl::Lower_Window(Am_Drawonable *target_d) //to bottom
{
  XWindowChanges values;
  unsigned int value_mask;

  if (target_d) {
    // Then place "this" window just below target_d
    value_mask = (CWSibling | CWStackMode);
    values.sibling = ((Am_Drawonable_Impl *)target_d)->xlib_drawable;
    values.stack_mode = Below;
  } else {
    // Then place "this" window at the bottom of the stack
    value_mask = CWStackMode;
    values.stack_mode = Below;
  }
  XReconfigureWMWindow(screen->display, xlib_drawable, screen->screen_number,
                       value_mask, &values);
  Flush_Output();
}